

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projections.c
# Opt level: O2

void icetProjectTile(IceTInt tile,IceTDouble *mat_out)

{
  int iVar1;
  int iVar2;
  IceTTimeStamp IVar3;
  IceTTimeStamp IVar4;
  IceTInt *pIVar5;
  IceTDouble *pIVar6;
  long lVar7;
  IceTDouble *pIVar8;
  IceTSizeType *pIVar9;
  byte bVar10;
  IceTInt num_tiles;
  IceTInt renderable_height;
  IceTInt renderable_width;
  IceTDouble tile_viewport_proj [16];
  IceTDouble viewport_proj [16];
  
  bVar10 = 0;
  IVar3 = icetStateGetTime(0x11);
  IVar4 = icetStateGetTime(0x94);
  if (IVar4 <= IVar3) {
    icetGetIntegerv(0x10,(IceTInt *)tile_viewport_proj);
    pIVar6 = icetStateAllocateDouble(0x94,tile_viewport_proj[0]._0_4_ << 4);
    pIVar5 = icetUnsafeStateGetInteger(0x11);
    pIVar9 = pIVar5 + 3;
    for (lVar7 = 0; lVar7 < tile_viewport_proj[0]._0_4_; lVar7 = lVar7 + 1) {
      icetGetViewportProject(pIVar9[-3],pIVar9[-2],pIVar9[-1],*pIVar9,pIVar6);
      pIVar6 = pIVar6 + 0x10;
      pIVar9 = pIVar9 + 4;
    }
  }
  icetGetIntegerv(0x10,&num_tiles);
  if ((tile < 0) || (num_tiles <= tile)) {
    icetRaiseDiagnostic("Bad tile passed to icetProjectTile.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/projections.c"
                        ,0x29);
  }
  else {
    pIVar5 = icetUnsafeStateGetInteger(0x11);
    iVar1 = pIVar5[(ulong)(uint)(tile * 4) + 2];
    iVar2 = pIVar5[(ulong)(uint)(tile * 4) + 3];
    icetGetIntegerv(7,&renderable_width);
    icetGetIntegerv(8,&renderable_height);
    pIVar6 = icetUnsafeStateGetDouble(0x94);
    if (renderable_height == iVar2 && renderable_width == iVar1) {
      pIVar6 = pIVar6 + (uint)(tile << 4);
      pIVar8 = tile_viewport_proj;
      for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
        *pIVar8 = *pIVar6;
        pIVar6 = pIVar6 + (ulong)bVar10 * -2 + 1;
        pIVar8 = pIVar8 + (ulong)bVar10 * -2 + 1;
      }
    }
    else {
      icetMatrixOrtho(-1.0,(IceTDouble)
                           (((double)renderable_width + (double)renderable_width) / (double)iVar1 +
                           -1.0),-1.0,
                      (IceTDouble)
                      (((double)renderable_height + (double)renderable_height) / (double)iVar2 +
                      -1.0),1.0,-1.0,viewport_proj);
      icetMatrixMultiply(tile_viewport_proj,viewport_proj,pIVar6 + (uint)(tile << 4));
    }
    pIVar6 = icetUnsafeStateGetDouble(0x81);
    icetMatrixMultiply(mat_out,tile_viewport_proj,pIVar6);
  }
  return;
}

Assistant:

void icetProjectTile(IceTInt tile, IceTDouble *mat_out)
{
    IceTInt num_tiles;
    const IceTInt *viewports;
    const IceTDouble *tile_projections;
    IceTInt tile_width, tile_height;
    IceTInt renderable_width, renderable_height;
    const IceTDouble *tile_proj;
    IceTDouble tile_viewport_proj[16];
    const IceTDouble *global_proj;

  /* Update tile projections. */
    update_tile_projections();

    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    if ((tile < 0) || (tile >= num_tiles)) {
        icetRaiseError("Bad tile passed to icetProjectTile.",
                       ICET_INVALID_VALUE);
        return;
    }

    viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    tile_width = viewports[tile*4+2];
    tile_height = viewports[tile*4+3];
    icetGetIntegerv(ICET_PHYSICAL_RENDER_WIDTH, &renderable_width);
    icetGetIntegerv(ICET_PHYSICAL_RENDER_HEIGHT, &renderable_height);
    tile_projections = icetUnsafeStateGetDouble(ICET_TILE_PROJECTIONS);

    tile_proj = tile_projections + 16*tile;

    if ((renderable_width != tile_width) || (renderable_height != tile_height)){
      /* Compensate for fact that tile is smaller than actual window.
         Use an orthographic projection to place the tile in the lower left
         corner of the tile. */
        IceTDouble viewport_proj[16];
        icetMatrixOrtho(-1.0, 2.0*renderable_width/tile_width - 1.0,
                        -1.0, 2.0*renderable_height/tile_height - 1.0,
                        1.0, -1.0, viewport_proj);

        icetMatrixMultiply(tile_viewport_proj,
                           (const IceTDouble *)viewport_proj,
                           (const IceTDouble *)tile_proj);
    } else {
        memcpy(tile_viewport_proj, (const IceTDouble*)tile_proj,
               16*sizeof(IceTDouble));
    }

  /* Project the user requested view to the tile projection. */
    global_proj = icetUnsafeStateGetDouble(ICET_PROJECTION_MATRIX);
    icetMatrixMultiply(mat_out,
                       (const IceTDouble *)tile_viewport_proj,
                       (const IceTDouble *)global_proj);
}